

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
emplaceRealloc<slang::IntervalMap<unsigned_long,std::monostate,3u>>
          (SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *this,pointer pos,
          IntervalMap<unsigned_long,_std::monostate,_3U> *args)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  ulong uVar5;
  long lVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  void *pvVar17;
  pointer pIVar18;
  uint32_t *puVar19;
  ulong uVar20;
  pointer pIVar21;
  long lVar22;
  
  if (*(long *)(this + 8) == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar20 = *(long *)(this + 8) + 1;
  uVar5 = *(ulong *)(this + 0x10);
  if (uVar20 < uVar5 * 2) {
    uVar20 = uVar5 * 2;
  }
  if (0x1ffffffffffffff - uVar5 < uVar5) {
    uVar20 = 0x1ffffffffffffff;
  }
  lVar22 = (long)pos - *(long *)this;
  pvVar17 = operator_new(uVar20 << 6);
  pIVar18 = (pointer)((long)pvVar17 + lVar22);
  *(undefined8 *)((long)pvVar17 + lVar22 + 0x38) = 0;
  uVar12._0_4_ = args->height;
  uVar12._4_4_ = args->rootSize;
  args->rootSize = 0;
  *(undefined8 *)((long)pvVar17 + lVar22 + 0x38) = uVar12;
  if ((undefined4)uVar12 == 0) {
    *(undefined8 *)
     &(pIVar18->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
      field_0x30 = *(undefined8 *)
                    &(args->field_0).rootLeaf.
                     super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                     .field_0x30;
    uVar7 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].left;
    uVar8 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].right;
    uVar9 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[1].left;
    uVar10 = (args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[1].right;
    uVar11 = (args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = (args->field_0).rootLeaf.
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
           first[2].left;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = uVar11;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = uVar9;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = uVar10;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = uVar7;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = uVar8;
  }
  else {
    uVar7 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].left;
    uVar8 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].right;
    uVar9 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[1].left;
    uVar10 = (args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[1].right;
    uVar11 = (args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = (args->field_0).rootLeaf.
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
           first[2].left;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = uVar11;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = uVar9;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = uVar10;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = uVar7;
    (pIVar18->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = uVar8;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = 0;
    *(undefined8 *)
     ((long)&(args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right + 4) = 0;
    *(undefined8 *)
     &(args->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
      field_0x34 = 0;
  }
  pIVar21 = *(pointer *)this;
  lVar6 = *(long *)(this + 8);
  if (pIVar21 + lVar6 == pos) {
    if (lVar6 != 0) {
      lVar22 = 0;
      do {
        puVar1 = (undefined4 *)((long)pvVar17 + lVar22 + 0x3c);
        puVar2 = (undefined8 *)((long)&pIVar21->field_0 + lVar22);
        *(undefined8 *)(puVar1 + -1) = 0;
        puVar1[-1] = *(undefined4 *)(puVar2 + 7);
        uVar4 = *(undefined4 *)((long)puVar2 + 0x3c);
        *(undefined4 *)((long)puVar2 + 0x3c) = 0;
        *puVar1 = uVar4;
        if (*(int *)(puVar2 + 7) == 0) {
          *(undefined8 *)(puVar1 + -3) = puVar2[6];
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          uVar15 = puVar2[3];
          uVar16 = puVar2[5];
          *(undefined8 *)(puVar1 + -7) = puVar2[4];
          *(undefined8 *)(puVar1 + -5) = uVar16;
          *(undefined8 *)(puVar1 + -0xb) = uVar14;
          *(undefined8 *)(puVar1 + -9) = uVar15;
          *(undefined8 *)(puVar1 + -0xf) = uVar12;
          *(undefined8 *)(puVar1 + -0xd) = uVar13;
        }
        else {
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          uVar15 = puVar2[3];
          uVar16 = puVar2[5];
          *(undefined8 *)(puVar1 + -7) = puVar2[4];
          *(undefined8 *)(puVar1 + -5) = uVar16;
          *(undefined8 *)(puVar1 + -0xb) = uVar14;
          *(undefined8 *)(puVar1 + -9) = uVar15;
          *(undefined8 *)(puVar1 + -0xf) = uVar12;
          *(undefined8 *)(puVar1 + -0xd) = uVar13;
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2[2] = 0;
          puVar2[3] = 0;
          puVar2[4] = 0;
          puVar2[5] = 0;
          *(undefined8 *)((long)puVar2 + 0x2c) = 0;
          *(undefined8 *)((long)puVar2 + 0x34) = 0;
        }
        lVar22 = lVar22 + 0x40;
      } while (lVar6 * 0x40 != lVar22);
    }
  }
  else {
    if (pIVar21 != pos) {
      puVar19 = (uint32_t *)((long)pvVar17 + 0x3c);
      do {
        puVar19[-1] = 0;
        puVar19[0] = 0;
        puVar19[-1] = pIVar21->height;
        uVar3 = pIVar21->rootSize;
        pIVar21->rootSize = 0;
        *puVar19 = uVar3;
        if (pIVar21->height == 0) {
          uVar4 = *(undefined4 *)((long)&pIVar21->field_0 + 0x34);
          puVar19[-3] = *(undefined4 *)((long)&pIVar21->field_0 + 0x30);
          puVar19[-2] = uVar4;
          uVar7 = (pIVar21->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar8 = (pIVar21->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar9 = (pIVar21->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar10 = (pIVar21->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[1].right;
          uVar11 = (pIVar21->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          *(unsigned_long *)(puVar19 + -7) =
               (pIVar21->field_0).rootLeaf.
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
               .first[2].left;
          *(unsigned_long *)(puVar19 + -5) = uVar11;
          *(unsigned_long *)(puVar19 + -0xb) = uVar9;
          *(unsigned_long *)(puVar19 + -9) = uVar10;
          *(unsigned_long *)(puVar19 + -0xf) = uVar7;
          *(unsigned_long *)(puVar19 + -0xd) = uVar8;
        }
        else {
          uVar7 = (pIVar21->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar8 = (pIVar21->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar9 = (pIVar21->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar10 = (pIVar21->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[1].right;
          uVar11 = (pIVar21->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          *(unsigned_long *)(puVar19 + -7) =
               (pIVar21->field_0).rootLeaf.
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
               .first[2].left;
          *(unsigned_long *)(puVar19 + -5) = uVar11;
          *(unsigned_long *)(puVar19 + -0xb) = uVar9;
          *(unsigned_long *)(puVar19 + -9) = uVar10;
          *(unsigned_long *)(puVar19 + -0xf) = uVar7;
          *(unsigned_long *)(puVar19 + -0xd) = uVar8;
          (pIVar21->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].left = 0;
          (pIVar21->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].right = 0;
          (pIVar21->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].left = 0;
          (pIVar21->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].right = 0;
          (pIVar21->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].left = 0;
          (pIVar21->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].right = 0;
          *(undefined8 *)
           ((long)&(pIVar21->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right + 4) = 0;
          *(undefined8 *)
           &(pIVar21->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            field_0x34 = 0;
        }
        pIVar21 = pIVar21 + 1;
        puVar19 = puVar19 + 0x10;
      } while (pIVar21 != pos);
    }
    pIVar21 = (pointer)(*(long *)(this + 8) * 0x40 + *(long *)this);
    if (pIVar21 != pos) {
      lVar22 = (long)pvVar17 + lVar22 + 0x7c;
      do {
        *(undefined8 *)(lVar22 + -4) = 0;
        uVar13._0_4_ = pos->height;
        uVar13._4_4_ = pos->rootSize;
        pos->rootSize = 0;
        *(undefined8 *)(lVar22 + -4) = uVar13;
        if ((undefined4)uVar13 == 0) {
          *(undefined8 *)(lVar22 + -0xc) =
               *(undefined8 *)
                &(pos->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .field_0x30;
          uVar7 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar8 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar9 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar10 = (pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[1].right;
          uVar11 = (pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          *(unsigned_long *)(lVar22 + -0x1c) =
               (pos->field_0).rootLeaf.
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
               .first[2].left;
          *(unsigned_long *)(lVar22 + -0x14) = uVar11;
          *(unsigned_long *)(lVar22 + -0x2c) = uVar9;
          *(unsigned_long *)(lVar22 + -0x24) = uVar10;
          *(unsigned_long *)(lVar22 + -0x3c) = uVar7;
          *(unsigned_long *)(lVar22 + -0x34) = uVar8;
        }
        else {
          uVar7 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar8 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar9 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar10 = (pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[1].right;
          uVar11 = (pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          *(unsigned_long *)(lVar22 + -0x1c) =
               (pos->field_0).rootLeaf.
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
               .first[2].left;
          *(unsigned_long *)(lVar22 + -0x14) = uVar11;
          *(unsigned_long *)(lVar22 + -0x2c) = uVar9;
          *(unsigned_long *)(lVar22 + -0x24) = uVar10;
          *(unsigned_long *)(lVar22 + -0x3c) = uVar7;
          *(unsigned_long *)(lVar22 + -0x34) = uVar8;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].left = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].right = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].left = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].right = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].left = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].right = 0;
          *(undefined8 *)
           ((long)&(pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right + 4) = 0;
          *(undefined8 *)
           &(pos->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            field_0x34 = 0;
        }
        pos = pos + 1;
        lVar22 = lVar22 + 0x40;
      } while (pos != pIVar21);
    }
  }
  if (*(SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> **)this != this + 0x18)
  {
    operator_delete(*(SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar20;
  *(void **)this = pvVar17;
  return pIVar18;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}